

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O1

QMimeData * __thiscall QTreeModel::mimeData(QTreeModel *this,QModelIndexList *indexes)

{
  long lVar1;
  iterator iVar2;
  iterator iVar3;
  ulong uVar4;
  long *plVar5;
  QMimeData *pQVar6;
  QModelIndex *pQVar7;
  QModelIndex *pQVar8;
  long in_FS_OFFSET;
  QList<QTreeWidgetItem_*> local_58;
  QTreeWidgetItem *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d.d = (Data *)0x0;
  local_58.d.ptr = (QTreeWidgetItem **)0x0;
  local_58.d.size = 0;
  lVar1 = (indexes->d).size;
  if (lVar1 != 0) {
    pQVar8 = (indexes->d).ptr;
    pQVar7 = pQVar8 + lVar1;
    do {
      local_40 = (QTreeWidgetItem *)(pQVar8->m).ptr;
      if (local_40 != (QTreeWidgetItem *)0x0) {
        local_40 = (QTreeWidgetItem *)pQVar8->i;
      }
      if ((pQVar8->c | pQVar8->r) < 0) {
        local_40 = (QTreeWidgetItem *)0x0;
      }
      QtPrivate::QPodArrayOps<QTreeWidgetItem*>::emplace<QTreeWidgetItem*&>
                ((QPodArrayOps<QTreeWidgetItem*> *)&local_58,local_58.d.size,&local_40);
      QList<QTreeWidgetItem_*>::end(&local_58);
      pQVar8 = pQVar8 + 1;
    } while (pQVar8 != pQVar7);
  }
  iVar2 = QList<QTreeWidgetItem_*>::begin(&local_58);
  iVar3 = QList<QTreeWidgetItem_*>::end(&local_58);
  if (iVar2.i != iVar3.i) {
    uVar4 = (long)iVar3.i - (long)iVar2.i >> 3;
    lVar1 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    std::
    __introsort_loop<QList<QTreeWidgetItem*>::iterator,long_long,__gnu_cxx::__ops::_Iter_less_iter>
              (iVar2.i,iVar3.i,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
    std::__final_insertion_sort<QList<QTreeWidgetItem*>::iterator,__gnu_cxx::__ops::_Iter_less_iter>
              (iVar2.i,iVar3.i);
  }
  iVar2 = QList<QTreeWidgetItem_*>::begin(&local_58);
  iVar3 = QList<QTreeWidgetItem_*>::end(&local_58);
  iVar2 = std::__unique<QList<QTreeWidgetItem*>::iterator,__gnu_cxx::__ops::_Iter_equal_to_iter>
                    (iVar2.i,iVar3.i);
  iVar3 = QList<QTreeWidgetItem_*>::end(&local_58);
  QList<QTreeWidgetItem_*>::erase(&local_58,(const_iterator)iVar2.i,(const_iterator)iVar3.i);
  QArrayDataPointer<QModelIndex>::operator=(&(this->cachedIndexes).d,&indexes->d);
  plVar5 = (long *)QMetaObject::cast((QObject *)&QTreeWidget::staticMetaObject);
  pQVar6 = (QMimeData *)(**(code **)(*plVar5 + 0x318))(plVar5,&local_58);
  QList<QModelIndex>::clear(&this->cachedIndexes);
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,8,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return pQVar6;
  }
  __stack_chk_fail();
}

Assistant:

QMimeData *QTreeModel::mimeData(const QModelIndexList &indexes) const
{
    QList<QTreeWidgetItem *> items;
    std::transform(indexes.begin(), indexes.end(), std::back_inserter(items),
                   [this](const QModelIndex &idx) -> QTreeWidgetItem * { return item(idx); });

    // Ensure we only have one item as an item may have more than
    // one index selected if there is more than one column
    std::sort(items.begin(), items.end());
    items.erase(std::unique(items.begin(), items.end()), items.end());

    // cachedIndexes is a little hack to avoid copying from QModelIndexList to
    // QList<QTreeWidgetItem*> and back again in the view
    cachedIndexes = indexes;
    QMimeData *mimeData = view()->mimeData(items);
    cachedIndexes.clear();
    return mimeData;
}